

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall Network::add(Network *this,Synapse *n_synapse)

{
  bool bVar1;
  Synapse *pSVar2;
  Synapse *local_18;
  
  local_18 = n_synapse;
  std::vector<Synapse_*,_std::allocator<Synapse_*>_>::push_back(&this->synapses,&local_18);
  pSVar2 = local_18;
  bVar1 = networkContainsPopulation(this,local_18->from_population);
  if (!bVar1) {
    std::vector<Population_*,_std::allocator<Population_*>_>::push_back
              (&this->populations,&pSVar2->from_population);
    pSVar2 = local_18;
  }
  bVar1 = networkContainsPopulation(this,pSVar2->to_population);
  if (!bVar1) {
    std::vector<Population_*,_std::allocator<Population_*>_>::push_back
              (&this->populations,&pSVar2->to_population);
  }
  return;
}

Assistant:

void Network::add(Synapse* n_synapse) {
    synapses.push_back(n_synapse);
    if(!networkContainsPopulation(n_synapse->from_population))
        populations.push_back(n_synapse->from_population);
    if(!networkContainsPopulation(n_synapse->to_population))
        populations.push_back(n_synapse->to_population);
}